

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_method.cc
# Opt level: O0

bool __thiscall
bssl::tls_set_read_state
          (bssl *this,SSL *ssl,ssl_encryption_level_t level,UniquePtr<SSLAEADContext> *aead_ctx,
          Span<const_unsigned_char> traffic_secret)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  pointer pSVar4;
  pointer this_00;
  SSL_CIPHER *pSVar5;
  uchar *puVar6;
  size_t sVar7;
  undefined4 in_register_00000014;
  UniquePtr<SSLAEADContext> *aead_ctx_local;
  ssl_encryption_level_t level_local;
  SSL *ssl_local;
  Span<const_unsigned_char> traffic_secret_local;
  
  traffic_secret_local.data_ = traffic_secret.data_;
  ssl_local = (SSL *)aead_ctx;
  bVar2 = tls_has_unprocessed_handshake_data((SSL *)this);
  if (bVar2) {
    ERR_put_error(0x10,0,0xff,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_method.cc"
                  ,0x30);
    ssl_send_alert((SSL *)this,2,10);
    return false;
  }
  iVar3 = SSL_is_quic((SSL *)this);
  if (iVar3 != 0) {
    bVar2 = std::operator==((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                            (*(long *)(this + 0x30) + 0x118),(nullptr_t)0x0);
    if ((bVar2) ||
       (pSVar4 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                            (*(long *)(this + 0x30) + 0x118)),
       (*(uint *)&pSVar4->field_0x6c8 >> 0x14 & 1) == 0)) {
      pcVar1 = (code *)**(undefined8 **)(this + 0x98);
      this_00 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                          ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
                           CONCAT44(in_register_00000014,level));
      pSVar5 = SSLAEADContext::cipher(this_00);
      puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ssl_local);
      sVar7 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
      iVar3 = (*pcVar1)(this,(ulong)ssl & 0xffffffff,pSVar5,puVar6,sVar7);
      if (iVar3 == 0) {
        return false;
      }
    }
    if ((int)ssl == 1) {
      return true;
    }
    *(int *)(*(long *)(this + 0x30) + 200) = (int)ssl;
  }
  **(undefined8 **)(this + 0x30) = 0;
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
            ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
             (*(long *)(this + 0x30) + 0x108),
             (unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
             CONCAT44(in_register_00000014,level));
  return true;
}

Assistant:

static bool tls_set_read_state(SSL *ssl, ssl_encryption_level_t level,
                               UniquePtr<SSLAEADContext> aead_ctx,
                               Span<const uint8_t> traffic_secret) {
  // Cipher changes are forbidden if the current epoch has leftover data.
  if (tls_has_unprocessed_handshake_data(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
    return false;
  }

  if (SSL_is_quic(ssl)) {
    if ((ssl->s3->hs == nullptr || !ssl->s3->hs->hints_requested) &&
        !ssl->quic_method->set_read_secret(ssl, level, aead_ctx->cipher(),
                                           traffic_secret.data(),
                                           traffic_secret.size())) {
      return false;
    }

    // QUIC only uses |ssl| for handshake messages, which never use early data
    // keys, so we return without installing anything. This avoids needing to
    // have two secrets active at once in 0-RTT.
    if (level == ssl_encryption_early_data) {
      return true;
    }
    ssl->s3->quic_read_level = level;
  }

  ssl->s3->read_sequence = 0;
  ssl->s3->aead_read_ctx = std::move(aead_ctx);
  return true;
}